

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall
duckdb::StringValueResult::AddValueToVector
          (StringValueResult *this,char *value_ptr,idx_t size,bool allocate)

{
  idx_t *chunk_idx;
  undefined8 *puVar1;
  ulong *puVar2;
  ParseTypeInfo *pPVar3;
  char cVar4;
  PhysicalType PVar5;
  CSVStateMachine *pCVar6;
  char *pcVar7;
  CSVReaderOptions *pCVar8;
  ValidityMask *pVVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var10;
  pointer ppvVar11;
  void *pvVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  bool bVar21;
  const_reference cVar22;
  DateCastResult DVar23;
  TemplatedValidityData<unsigned_long> *pTVar24;
  reference pvVar25;
  ostream *poVar26;
  reference pvVar27;
  InvalidInputException *this_01;
  InternalException *pIVar28;
  uint uVar29;
  undefined7 in_register_00000009;
  timestamp_t *result;
  idx_t *piVar31;
  LogicalTypeId type;
  PhysicalType type_00;
  PhysicalType type_01;
  char *pcVar32;
  char *pcVar33;
  idx_t iVar34;
  long lVar35;
  byte strict;
  ulong uVar36;
  idx_t *col_idx;
  bool bVar37;
  bool bVar38;
  anon_union_16_2_67f50693_for_value aVar39;
  string_t data;
  bool special;
  string strip_thousands;
  idx_t pos;
  string local_268;
  char *local_248;
  uint local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 local_22c;
  idx_t *local_228;
  _Head_base<0UL,_unsigned_long_*,_false> local_220;
  char *local_218;
  duckdb local_210 [16];
  LinePosition *local_200;
  LineError *local_1f8;
  idx_t *local_1f0;
  string local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  string local_1a8 [3];
  ios_base local_138 [264];
  ulong uVar30;
  
  local_22c = (undefined4)CONCAT71(in_register_00000009,allocate);
  bVar21 = HandleTooManyColumnsError(this,value_ptr,size);
  if (bVar21) {
    return;
  }
  col_idx = &this->cur_col_id;
  uVar36 = this->cur_col_id;
  if (this->number_of_columns <= uVar36) {
    pCVar6 = (this->super_ScannerResult).state_machine;
    if ((pCVar6->state_machine_options).strict_mode.value != true) {
      return;
    }
    if ((uVar36 == this->number_of_columns) &&
       ((((this->super_ScannerResult).quoted != true ||
         (pCVar6->options->allow_quoted_nulls != false)) && (this->null_str_count != 0)))) {
      bVar21 = false;
      iVar34 = 0;
      do {
        bVar38 = !bVar21;
        bVar21 = true;
        if (((bVar38) && (bVar21 = size == 0, size != 0)) &&
           (pcVar33 = (this->null_str_ptr).
                      super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                      super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t
                      .super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                      super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar34],
           *pcVar33 == *value_ptr)) {
          uVar36 = 1;
          do {
            uVar30 = uVar36;
            if (size == uVar30) break;
            uVar36 = uVar30 + 1;
          } while (pcVar33[uVar30] == value_ptr[uVar30]);
          bVar21 = size <= uVar30;
        }
        iVar34 = iVar34 + 1;
      } while (iVar34 != this->null_str_count);
      if (bVar21) {
        return;
      }
    }
    local_1a8[0]._M_dataplus._M_p._0_4_ = CONCAT31(local_1a8[0]._M_dataplus._M_p._1_3_,3);
    LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,&this->chunk_col_id,
                      &(this->super_ScannerResult).last_position,0);
    this->cur_col_id = this->cur_col_id + 1;
    return;
  }
  if ((this->projecting_columns == true) &&
     ((this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar36] == false)) {
    *col_idx = uVar36 + 1;
    return;
  }
  bVar21 = (this->super_ScannerResult).quoted;
  local_248 = (char *)size;
  if ((bVar21 != true) ||
     (strict = 1, ((this->super_ScannerResult).state_machine)->options->allow_quoted_nulls != false)
     ) {
    if (((((this->super_ScannerResult).state_machine)->state_machine_options).strict_mode.value ==
         false) && ((this->super_ScannerResult).escaped == true)) {
      strict = (bVar21 ^ 1U) & size == 1;
    }
    else {
      strict = 0;
    }
    bVar21 = this->null_str_count != 0;
    if (bVar21) {
      bVar38 = size == 0;
      local_228 = &this->chunk_col_id;
      local_1f8 = &this->current_errors;
      local_200 = &(this->super_ScannerResult).last_position;
      uVar36 = 0;
      local_1f0 = col_idx;
      do {
        pcVar33 = (char *)(this->null_str_size).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar36];
        if ((pcVar33 == (char *)0x2) &&
           (pcVar7 = (this->null_str_ptr).
                     super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                     super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                     super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar36],
           *pcVar7 ==
           (((this->super_ScannerResult).state_machine)->state_machine_options).escape.value)) {
          if (strict == 0) {
LAB_01817d4a:
            bVar37 = false;
          }
          else {
            bVar37 = pcVar7[1] == *value_ptr;
          }
        }
        else {
          if (pcVar33 != (char *)size || strict != 0) goto LAB_01817d4a;
          bVar37 = bVar38;
          if (((char *)size != (char *)0x0) &&
             (pcVar33 = (this->null_str_ptr).
                        super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
                        super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
                        super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar36],
             *pcVar33 == *value_ptr)) {
            pcVar7 = &DAT_00000001;
            do {
              pcVar32 = pcVar7;
              if ((char *)size == pcVar32) break;
              pcVar7 = pcVar32 + 1;
            } while (pcVar33[(long)pcVar32] == value_ptr[(long)pcVar32]);
            bVar37 = size <= pcVar32;
          }
        }
        if (bVar37) {
          pCVar8 = ((this->super_ScannerResult).state_machine)->options;
          if ((this->chunk_col_id <
               (ulong)*(uint *)((long)&(pCVar8->force_not_null).
                                       super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base +
                               8) +
               ((long)(pCVar8->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_p -
               (long)(pCVar8->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p) * 8) &&
             (cVar22 = vector<bool,_true>::get<true>(&pCVar8->force_not_null,this->chunk_col_id),
             cVar22)) {
            if (*(LogicalTypeId *)
                 ((long)((this->parse_types).
                         super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                         .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                        this->chunk_col_id) + 1) == VARCHAR) {
              puVar1 = (undefined8 *)
                       ((long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_start[this->chunk_col_id] +
                       this->number_of_rows * 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
            }
            else {
              local_1a8[0]._M_dataplus._M_p._0_4_ = (uint)local_1a8[0]._M_dataplus._M_p & 0xffffff00
              ;
              LineError::Insert(local_1f8,(CSVErrorType *)local_1a8,col_idx,local_228,local_200,0);
            }
LAB_01817f10:
            *col_idx = *col_idx + 1;
            *local_228 = *local_228 + 1;
          }
          else if (this->chunk_col_id != (ulong)this->number_of_columns) {
            uVar30 = this->number_of_rows;
            pVVar9 = (this->validity_mask).
                     super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                     super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[this->chunk_col_id];
            if ((pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              local_220._M_head_impl =
                   (unsigned_long *)(pVVar9->super_TemplatedValidityMask<unsigned_long>).capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)local_1a8,(unsigned_long *)&local_220);
              uVar15 = CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,
                                (uint)local_1a8[0]._M_dataplus._M_p);
              p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        CONCAT44(local_1a8[0]._M_string_length._4_4_,
                                 (undefined4)local_1a8[0]._M_string_length);
              local_1a8[0]._M_dataplus._M_p._0_4_ = 0;
              local_1a8[0]._M_dataplus._M_p._4_4_ = 0;
              local_1a8[0]._M_string_length._0_4_ = 0;
              local_1a8[0]._M_string_length._4_4_ = 0;
              this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data +
                        8))->_M_pi;
              (pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar15;
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))->
              _M_pi = p_Var16;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_1a8[0]._M_string_length._4_4_,
                           (undefined4)local_1a8[0]._M_string_length) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(local_1a8[0]._M_string_length._4_4_,
                                    (undefined4)local_1a8[0]._M_string_length));
              }
              pTVar24 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(pVVar9->super_TemplatedValidityMask<unsigned_long>).
                                    validity_data);
              (pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                   (unsigned_long *)
                   (pTVar24->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar13 = (byte)uVar30 & 0x3f;
            puVar2 = (pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                     (uVar30 >> 6);
            *puVar2 = *puVar2 & (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
            size = (idx_t)local_248;
            col_idx = local_1f0;
            goto LAB_01817f10;
          }
          if (bVar37) {
            if (bVar21) {
              return;
            }
            break;
          }
        }
        uVar36 = uVar36 + 1;
        bVar21 = uVar36 < this->null_str_count;
      } while (bVar21);
    }
  }
  local_220._M_head_impl = (unsigned_long *)local_210;
  local_218 = (char *)0x0;
  local_210[0] = (duckdb)0x0;
  bVar21 = LogicalType::IsNumeric
                     (*(LogicalTypeId *)
                       ((long)((this->parse_types).
                               super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                               .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl +
                              this->chunk_col_id) + 1));
  pcVar33 = local_248;
  if ((bVar21) &&
     (cVar4 = ((this->super_ScannerResult).state_machine)->options->thousands_separator,
     cVar4 != '\0')) {
    BaseScanner::RemoveSeparator_abi_cxx11_
              (local_1a8,(BaseScanner *)value_ptr,local_248,(ulong)(uint)(int)cVar4,strict);
    ::std::__cxx11::string::operator=((string *)&local_220,(string *)local_1a8);
    pcVar33 = local_218;
    value_ptr = (char *)local_220._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,(uint)local_1a8[0]._M_dataplus._M_p) !=
        &local_1a8[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,
                               (uint)local_1a8[0]._M_dataplus._M_p));
      pcVar33 = local_218;
      value_ptr = (char *)local_220._M_head_impl;
    }
  }
  chunk_idx = &this->chunk_col_id;
  _Var10._M_head_impl =
       (this->parse_types).
       super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t
       .super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
       .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
  iVar34 = this->chunk_col_id;
  pPVar3 = _Var10._M_head_impl + iVar34;
  uVar29 = *(LogicalTypeId *)((long)(_Var10._M_head_impl + iVar34) + 1) - 10;
  uVar30 = (ulong)uVar29;
  uVar36 = uVar30;
  if (uVar29 < 0x17) {
    uVar36 = (long)&switchD_0181803a::switchdataD_01e58d44 +
             (long)(int)(&switchD_0181803a::switchdataD_01e58d44)[uVar30];
    switch(uVar30) {
    case 0:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TryCastStringBool(value_ptr,(idx_t)pcVar33,
                                 (bool *)((long)ppvVar11[iVar34] + this->number_of_rows),
                                 SUB81(ppvVar11,0));
      break;
    case 1:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<signed_char,true>
                         ((duckdb *)value_ptr,pcVar33,(long)ppvVar11[iVar34] + this->number_of_rows,
                          (char *)ppvVar11,(bool)strict);
      break;
    case 2:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<short,true>
                         (value_ptr,(idx_t)pcVar33,
                          (short *)(this->number_of_rows * 2 + (long)ppvVar11[iVar34]),
                          SUB81(ppvVar11,0));
      break;
    case 3:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<int,true>
                         (value_ptr,(idx_t)pcVar33,
                          (int *)(this->number_of_rows * 4 + (long)ppvVar11[iVar34]),
                          SUB81(ppvVar11,0));
      break;
    case 4:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<long,true>
                         (value_ptr,(idx_t)pcVar33,
                          (long *)(this->number_of_rows * 8 + (long)ppvVar11[iVar34]),
                          SUB81(ppvVar11,0));
      break;
    case 5:
      bVar21 = StrTimeFormat::Empty(&(this->date_format).super_StrTimeFormat);
      if (bVar21) {
        DVar23 = Date::TryConvertDate
                           (value_ptr,(idx_t)pcVar33,(idx_t *)local_1a8,
                            (date_t *)
                            (this->number_of_rows * 4 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->chunk_col_id]),
                            (bool *)&local_268,false);
LAB_01818159:
        bVar21 = DVar23 == SUCCESS;
      }
      else {
        bVar21 = StrpTimeFormat::TryParseDate
                           (&this->date_format,value_ptr,(size_t)pcVar33,
                            (date_t *)
                            (this->number_of_rows * 4 +
                            (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->chunk_col_id]));
      }
      break;
    case 6:
      bVar21 = Time::TryConvertTime
                         (value_ptr,(idx_t)pcVar33,(idx_t *)local_1a8,
                          (dtime_t *)
                          (this->number_of_rows * 8 +
                          (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar34]),false,
                          (optional_ptr<int,_true>)0x0);
      break;
    default:
      goto switchD_0181803a_caseD_11;
    case 9:
    case 0x16:
      bVar21 = StrTimeFormat::Empty(&(this->timestamp_format).super_StrTimeFormat);
      result = (timestamp_t *)
               (this->number_of_rows * 8 +
               (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_start[this->chunk_col_id]);
      if (bVar21) {
        DVar23 = Timestamp::TryConvertTimestamp
                           (value_ptr,(idx_t)pcVar33,result,(optional_ptr<int,_true>)0x0,false);
        goto LAB_01818159;
      }
      bVar21 = StrpTimeFormat::TryParseTimestamp
                         (&this->timestamp_format,value_ptr,(size_t)pcVar33,result);
      break;
    case 0xb:
      if (this->decimal_separator == '.') {
        PVar5 = pPVar3->internal_type;
        if (PVar5 < INT64) {
          if (PVar5 == INT16) {
            bVar21 = TryDecimalStringCast<short,(char)46>
                               (value_ptr,(idx_t)pcVar33,
                                (short *)(this->number_of_rows * 2 +
                                         (long)(this->vector_ptr).
                                               super_vector<void_*,_std::allocator<void_*>_>.
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_start[iVar34]),
                                pPVar3->width,pPVar3->scale);
          }
          else {
            if (PVar5 != INT32) {
LAB_01818920:
              pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
              TypeIdToString_abi_cxx11_
                        (&local_268,
                         (duckdb *)
                         (ulong)*(PhysicalType *)
                                 ((long)((this->parse_types).
                                         super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                         .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                         _M_head_impl + this->chunk_col_id) + 2),type_00);
              ::std::operator+(local_1a8,"Invalid Physical Type for Decimal Value. Physical Type: ",
                               &local_268);
              InternalException::InternalException(pIVar28,local_1a8);
              __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            bVar21 = TryDecimalStringCast<int,(char)46>
                               (value_ptr,(idx_t)pcVar33,
                                (int *)(this->number_of_rows * 4 +
                                       (long)(this->vector_ptr).
                                             super_vector<void_*,_std::allocator<void_*>_>.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar34]),
                                pPVar3->width,pPVar3->scale);
          }
        }
        else if (PVar5 == INT64) {
          bVar21 = TryDecimalStringCast<long,(char)46>
                             (value_ptr,(idx_t)pcVar33,
                              (long *)(this->number_of_rows * 8 +
                                      (long)(this->vector_ptr).
                                            super_vector<void_*,_std::allocator<void_*>_>.
                                            super__Vector_base<void_*,_std::allocator<void_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start[iVar34]),
                              pPVar3->width,pPVar3->scale);
        }
        else {
          if (PVar5 != INT128) goto LAB_01818920;
          bVar21 = TryDecimalStringCast<duckdb::hugeint_t,(char)46>
                             (value_ptr,(idx_t)pcVar33,
                              (hugeint_t *)
                              (this->number_of_rows * 0x10 +
                              (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>
                                    .super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar34]),pPVar3->width,
                              pPVar3->scale);
        }
      }
      else {
        if (this->decimal_separator != ',') {
          this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "Decimals can only have \',\' and \'.\' as decimal separators","");
          InvalidInputException::InvalidInputException(this_01,local_1a8);
          __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        PVar5 = pPVar3->internal_type;
        if (PVar5 < INT64) {
          if (PVar5 == INT16) {
            bVar21 = TryDecimalStringCast<short,(char)44>
                               (value_ptr,(idx_t)pcVar33,
                                (short *)(this->number_of_rows * 2 +
                                         (long)(this->vector_ptr).
                                               super_vector<void_*,_std::allocator<void_*>_>.
                                               super__Vector_base<void_*,_std::allocator<void_*>_>.
                                               _M_impl.super__Vector_impl_data._M_start[iVar34]),
                                pPVar3->width,pPVar3->scale);
          }
          else {
            if (PVar5 != INT32) {
LAB_01818994:
              pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
              TypeIdToString_abi_cxx11_
                        (&local_268,
                         (duckdb *)
                         (ulong)*(PhysicalType *)
                                 ((long)((this->parse_types).
                                         super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                         .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                         _M_head_impl + this->chunk_col_id) + 2),type_01);
              ::std::operator+(local_1a8,"Invalid Physical Type for Decimal Value. Physical Type: ",
                               &local_268);
              InternalException::InternalException(pIVar28,local_1a8);
              __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            bVar21 = TryDecimalStringCast<int,(char)44>
                               (value_ptr,(idx_t)pcVar33,
                                (int *)(this->number_of_rows * 4 +
                                       (long)(this->vector_ptr).
                                             super_vector<void_*,_std::allocator<void_*>_>.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar34]),
                                pPVar3->width,pPVar3->scale);
          }
        }
        else if (PVar5 == INT64) {
          bVar21 = TryDecimalStringCast<long,(char)44>
                             (value_ptr,(idx_t)pcVar33,
                              (long *)(this->number_of_rows * 8 +
                                      (long)(this->vector_ptr).
                                            super_vector<void_*,_std::allocator<void_*>_>.
                                            super__Vector_base<void_*,_std::allocator<void_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start[iVar34]),
                              pPVar3->width,pPVar3->scale);
        }
        else {
          if (PVar5 != INT128) goto LAB_01818994;
          bVar21 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                             (value_ptr,(idx_t)pcVar33,
                              (hugeint_t *)
                              (this->number_of_rows * 0x10 +
                              (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>
                                    .super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar34]),pPVar3->width,
                              pPVar3->scale);
        }
      }
      break;
    case 0xc:
      bVar21 = TryDoubleCast<float>
                         (value_ptr,(idx_t)pcVar33,
                          (float *)(this->number_of_rows * 4 +
                                   (long)(this->vector_ptr).
                                         super_vector<void_*,_std::allocator<void_*>_>.
                                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                         .super__Vector_impl_data._M_start[iVar34]),
                          (bool)*(((this->super_ScannerResult).state_machine)->options->
                                 decimal_separator)._M_dataplus._M_p,strict);
      break;
    case 0xd:
      bVar21 = TryDoubleCast<double>
                         (value_ptr,(idx_t)pcVar33,
                          (double *)
                          (this->number_of_rows * 8 +
                          (long)(this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar34]),
                          (bool)*(((this->super_ScannerResult).state_machine)->options->
                                 decimal_separator)._M_dataplus._M_p,strict);
      break;
    case 0x12:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<unsigned_char,false>
                         (value_ptr,(idx_t)pcVar33,
                          (uchar *)((long)ppvVar11[iVar34] + this->number_of_rows),SUB81(ppvVar11,0)
                         );
      break;
    case 0x13:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<unsigned_short,false>
                         (value_ptr,(idx_t)pcVar33,
                          (unsigned_short *)(this->number_of_rows * 2 + (long)ppvVar11[iVar34]),
                          SUB81(ppvVar11,0));
      break;
    case 0x14:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<unsigned_int,false>
                         (value_ptr,(idx_t)pcVar33,
                          (uint *)(this->number_of_rows * 4 + (long)ppvVar11[iVar34]),
                          SUB81(ppvVar11,0));
      break;
    case 0x15:
      ppvVar11 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start;
      bVar21 = TrySimpleIntegerCast<unsigned_long,false>
                         (value_ptr,(idx_t)pcVar33,
                          (unsigned_long *)(this->number_of_rows * 8 + (long)ppvVar11[iVar34]),
                          SUB81(ppvVar11,0));
    }
    if (bVar21 == false) {
      local_1a8[0]._M_dataplus._M_p._0_4_ = (uint)local_1a8[0]._M_dataplus._M_p & 0xffffff00;
      LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,chunk_idx,
                        &(this->super_ScannerResult).last_position,0);
      bVar21 = CSVReaderOptions::IgnoreErrors(((this->super_ScannerResult).state_machine)->options);
      if (!bVar21) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Could not convert string \"",0x1a);
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,value_ptr,pcVar33 + (long)value_ptr);
        poVar26 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_268._M_dataplus._M_p,
                             local_268._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\" to \'",6);
        LogicalTypeIdToString_abi_cxx11_
                  (&local_1e8,
                   (duckdb *)
                   (ulong)*(LogicalTypeId *)
                           ((long)((this->parse_types).
                                   super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
                                   .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>.
                                   _M_head_impl + this->chunk_col_id) + 1),type);
        poVar26 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar26,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\'",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        ::std::__cxx11::stringbuf::str();
        FullLinePosition::SanitizeError(&local_268);
        local_1c8[0] = local_1b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,local_268._M_dataplus._M_p,
                   local_268._M_dataplus._M_p + local_268._M_string_length);
        pvVar27 = vector<duckdb::CurrentError,_true>::back(&(this->current_errors).current_errors);
        ::std::__cxx11::string::operator=((string *)&pvVar27->error_message,(string *)local_1c8);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
    }
  }
  else {
switchD_0181803a_caseD_11:
    if ((pPVar3->validate_utf8 != true) ||
       (bVar21 = Utf8Proc::IsValid(value_ptr,(ulong)pcVar33 & 0xffffffff), bVar21)) {
      uVar19 = (undefined4)local_1a8[0]._M_string_length;
      uVar17 = local_1a8[0]._M_dataplus._M_p._4_4_;
      uVar29 = (uint)pcVar33;
      local_1a8[0]._M_dataplus._M_p._4_4_ = SUB84(value_ptr,0);
      uVar18 = local_1a8[0]._M_dataplus._M_p._4_4_;
      local_1a8[0]._M_string_length._0_4_ = (undefined4)((ulong)value_ptr >> 0x20);
      uVar20 = (undefined4)local_1a8[0]._M_string_length;
      if ((char)local_22c == '\0') {
        if (uVar29 < 0xd) {
          local_1a8[0]._M_string_length._0_4_ = 0;
          local_1a8[0]._M_dataplus._M_p._0_4_ = 0;
          local_1a8[0]._M_dataplus._M_p._4_4_ = 0;
          if (uVar29 != 0) {
            switchD_01602a8a::default(local_1a8,value_ptr,(ulong)(uVar29 & 0xf));
          }
        }
        else {
          local_1a8[0]._M_dataplus._M_p._0_4_ = *(uint *)value_ptr;
        }
        pvVar12 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
                  super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start[this->chunk_col_id];
        lVar35 = this->number_of_rows * 0x10;
        *(uint *)((long)pvVar12 + lVar35) = uVar29;
        *(ulong *)((long)pvVar12 + lVar35 + 4) =
             CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,(uint)local_1a8[0]._M_dataplus._M_p);
        *(undefined4 *)((long)pvVar12 + lVar35 + 0xc) = (undefined4)local_1a8[0]._M_string_length;
        goto LAB_01818894;
      }
      local_1a8[0]._M_dataplus._M_p._4_4_ = uVar17;
      local_1a8[0]._M_string_length._0_4_ = uVar19;
      pvVar25 = vector<duckdb::Vector,_true>::operator[]
                          (&(this->parse_chunk).data,this->chunk_col_id);
      local_240 = uVar29;
      if (uVar29 < 0xd) {
        uStack_234 = 0;
        uStack_23c = 0;
        uStack_238 = 0;
        if (uVar29 != 0) {
          switchD_01602a8a::default(&uStack_23c,value_ptr,(ulong)(uVar29 & 0xf));
        }
      }
      else {
        uStack_23c = *(undefined4 *)value_ptr;
        uStack_238 = uVar18;
        uStack_234 = uVar20;
      }
      data.value._4_1_ = (undefined1)uStack_234;
      data.value._5_1_ = uStack_234._1_1_;
      data.value._6_1_ = uStack_234._2_1_;
      data.value._7_1_ = uStack_234._3_1_;
      data.value.pointer.length = uStack_238;
      data.value.pointer.ptr = (char *)uVar36;
      aVar39.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)pvVar25,(Vector *)CONCAT44(uStack_23c,local_240),data);
    }
    else {
      if (((((this->super_ScannerResult).state_machine)->options->ignore_errors).value == false) &&
         ((this->sniffing & 1U) != 0)) {
        HandleUnicodeError(this,this->cur_col_id,&(this->super_ScannerResult).last_position);
      }
      local_1a8[0]._M_dataplus._M_p._0_4_ = CONCAT31(local_1a8[0]._M_dataplus._M_p._1_3_,8);
      piVar31 = chunk_idx;
      LineError::Insert(&this->current_errors,(CSVErrorType *)local_1a8,col_idx,chunk_idx,
                        &(this->super_ScannerResult).last_position,0);
      pvVar25 = vector<duckdb::Vector,_true>::operator[]
                          (&(this->parse_chunk).data,this->chunk_col_id);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = piVar31;
      aVar39.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)pvVar25,(Vector *)0x0,(string_t)(auVar14 << 0x40));
    }
    pvVar12 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
              _M_start[this->chunk_col_id];
    lVar35 = this->number_of_rows * 0x10;
    *(long *)((long)pvVar12 + lVar35) = aVar39._0_8_;
    *(char **)((long)pvVar12 + lVar35 + 8) = aVar39.pointer.ptr;
  }
LAB_01818894:
  *col_idx = *col_idx + 1;
  *chunk_idx = *chunk_idx + 1;
  if ((duckdb *)local_220._M_head_impl != local_210) {
    operator_delete(local_220._M_head_impl);
  }
  return;
}

Assistant:

void StringValueResult::AddValueToVector(const char *value_ptr, idx_t size, bool allocate) {
	if (HandleTooManyColumnsError(value_ptr, size)) {
		return;
	}
	if (cur_col_id >= number_of_columns) {
		if (!state_machine.state_machine_options.strict_mode.GetValue()) {
			return;
		}
		bool error = true;
		if (cur_col_id == number_of_columns && ((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
			// we make an exception if the first over-value is null
			bool is_value_null = false;
			for (idx_t i = 0; i < null_str_count; i++) {
				is_value_null = is_value_null || IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			error = !is_value_null;
		}
		if (error) {
			// We error pointing to the current value error.
			current_errors.Insert(TOO_MANY_COLUMNS, cur_col_id, chunk_col_id, last_position);
			cur_col_id++;
		}
		return;
	}

	if (projecting_columns) {
		if (!projected_columns[cur_col_id]) {
			cur_col_id++;
			return;
		}
	}

	if (((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
		// Check for the occurrence of escaped null string like \N only if strict_mode is disabled
		const bool check_unquoted_escaped_null =
		    state_machine.state_machine_options.strict_mode.GetValue() == false && escaped && !quoted && size == 1;
		for (idx_t i = 0; i < null_str_count; i++) {
			bool is_null = false;
			if (null_str_size[i] == 2 && null_str_ptr[i][0] == state_machine.state_machine_options.escape.GetValue()) {
				is_null = check_unquoted_escaped_null && null_str_ptr[i][1] == value_ptr[0];
			} else if (size == null_str_size[i] && !check_unquoted_escaped_null) {
				is_null = IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			if (is_null) {
				bool empty = false;
				if (chunk_col_id < state_machine.options.force_not_null.size()) {
					empty = state_machine.options.force_not_null[chunk_col_id];
				}
				if (empty) {
					if (parse_types[chunk_col_id].type_id != LogicalTypeId::VARCHAR) {
						// If it is not a varchar, empty values are not accepted, we must error.
						current_errors.Insert(CAST_ERROR, cur_col_id, chunk_col_id, last_position);
					} else {
						static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = string_t();
					}
				} else {
					if (chunk_col_id == number_of_columns) {
						// We check for a weird case, where we ignore an extra value, if it is a null value
						return;
					}
					validity_mask[chunk_col_id]->SetInvalid(static_cast<idx_t>(number_of_rows));
				}
				cur_col_id++;
				chunk_col_id++;
				return;
			}
		}
	}
	bool success = true;
	string strip_thousands;
	if (LogicalType::IsNumeric(parse_types[chunk_col_id].type_id) &&
	    state_machine.options.thousands_separator != '\0') {
		// If we have a thousands separator we should try to use that
		strip_thousands = BaseScanner::RemoveSeparator(value_ptr, size, state_machine.options.thousands_separator);
		value_ptr = strip_thousands.c_str();
		size = strip_thousands.size();
	}
	switch (parse_types[chunk_col_id].type_id) {
	case LogicalTypeId::BOOLEAN:
		success =
		    TryCastStringBool(value_ptr, size, static_cast<bool *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::TINYINT:
		success = TrySimpleIntegerCast(value_ptr, size, static_cast<int8_t *>(vector_ptr[chunk_col_id])[number_of_rows],
		                               false);
		break;
	case LogicalTypeId::SMALLINT:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::INTEGER:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::BIGINT:
		success = TrySimpleIntegerCast(value_ptr, size,
		                               static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UTINYINT:
		success = TrySimpleIntegerCast<uint8_t, false>(
		    value_ptr, size, static_cast<uint8_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::USMALLINT:
		success = TrySimpleIntegerCast<uint16_t, false>(
		    value_ptr, size, static_cast<uint16_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UINTEGER:
		success = TrySimpleIntegerCast<uint32_t, false>(
		    value_ptr, size, static_cast<uint32_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::UBIGINT:
		success = TrySimpleIntegerCast<uint64_t, false>(
		    value_ptr, size, static_cast<uint64_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	case LogicalTypeId::DOUBLE:
		success =
		    TryDoubleCast<double>(value_ptr, size, static_cast<double *>(vector_ptr[chunk_col_id])[number_of_rows],
		                          false, state_machine.options.decimal_separator[0]);
		break;
	case LogicalTypeId::FLOAT:
		success = TryDoubleCast<float>(value_ptr, size, static_cast<float *>(vector_ptr[chunk_col_id])[number_of_rows],
		                               false, state_machine.options.decimal_separator[0]);
		break;
	case LogicalTypeId::DATE: {
		if (!date_format.Empty()) {
			success = date_format.TryParseDate(value_ptr, size,
			                                   static_cast<date_t *>(vector_ptr[chunk_col_id])[number_of_rows]);
		} else {
			idx_t pos;
			bool special;
			success = Date::TryConvertDate(value_ptr, size, pos,
			                               static_cast<date_t *>(vector_ptr[chunk_col_id])[number_of_rows], special,
			                               false) == DateCastResult::SUCCESS;
		}
		break;
	}
	case LogicalTypeId::TIME: {
		idx_t pos;
		success = Time::TryConvertTime(value_ptr, size, pos,
		                               static_cast<dtime_t *>(vector_ptr[chunk_col_id])[number_of_rows], false);
		break;
	}
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ: {
		if (!timestamp_format.Empty()) {
			success = timestamp_format.TryParseTimestamp(
			    value_ptr, size, static_cast<timestamp_t *>(vector_ptr[chunk_col_id])[number_of_rows]);
		} else {
			success = Timestamp::TryConvertTimestamp(
			              value_ptr, size, static_cast<timestamp_t *>(vector_ptr[chunk_col_id])[number_of_rows]) ==
			          TimestampCastResult::SUCCESS;
		}
		break;
	}
	case LogicalTypeId::DECIMAL: {
		if (decimal_separator == ',') {
			switch (parse_types[chunk_col_id].internal_type) {
			case PhysicalType::INT16:
				success = TryDecimalStringCast<int16_t, ','>(
				    value_ptr, size, static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT32:
				success = TryDecimalStringCast<int32_t, ','>(
				    value_ptr, size, static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT64:
				success = TryDecimalStringCast<int64_t, ','>(
				    value_ptr, size, static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT128:
				success = TryDecimalStringCast<hugeint_t, ','>(
				    value_ptr, size, static_cast<hugeint_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				    parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(parse_types[chunk_col_id].internal_type));
			}

		} else if (decimal_separator == '.') {
			switch (parse_types[chunk_col_id].internal_type) {
			case PhysicalType::INT16:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int16_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT32:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int32_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT64:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<int64_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			case PhysicalType::INT128:
				success = TryDecimalStringCast(value_ptr, size,
				                               static_cast<hugeint_t *>(vector_ptr[chunk_col_id])[number_of_rows],
				                               parse_types[chunk_col_id].width, parse_types[chunk_col_id].scale);
				break;
			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(parse_types[chunk_col_id].internal_type));
			}
		} else {
			throw InvalidInputException("Decimals can only have ',' and '.' as decimal separators");
		}
		break;
	}
	default: {
		// By default, we add a string
		// We only evaluate if a string is utf8 valid, if it's actually a varchar
		if (parse_types[chunk_col_id].validate_utf8 &&
		    !Utf8Proc::IsValid(value_ptr, UnsafeNumericCast<uint32_t>(size))) {
			bool force_error = !state_machine.options.ignore_errors.GetValue() && sniffing;
			// Invalid unicode, we must error
			if (force_error) {
				HandleUnicodeError(cur_col_id, last_position);
			}
			// If we got here, we are ignoring errors, hence we must ignore this line.
			current_errors.Insert(INVALID_ENCODING, cur_col_id, chunk_col_id, last_position);
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = StringVector::AddStringOrBlob(
			    parse_chunk.data[chunk_col_id], string_t(value_ptr, UnsafeNumericCast<uint32_t>(0)));
			break;
		}
		if (allocate) {
			// If it's a value produced over multiple buffers, we must allocate
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] = StringVector::AddStringOrBlob(
			    parse_chunk.data[chunk_col_id], string_t(value_ptr, UnsafeNumericCast<uint32_t>(size)));
		} else {
			static_cast<string_t *>(vector_ptr[chunk_col_id])[number_of_rows] =
			    string_t(value_ptr, UnsafeNumericCast<uint32_t>(size));
		}
		break;
	}
	}
	if (!success) {
		current_errors.Insert(CAST_ERROR, cur_col_id, chunk_col_id, last_position);
		if (!state_machine.options.IgnoreErrors()) {
			// We have to write the cast error message.
			std::ostringstream error;
			// Casting Error Message
			error << "Could not convert string \"" << std::string(value_ptr, size) << "\" to \'"
			      << LogicalTypeIdToString(parse_types[chunk_col_id].type_id) << "\'";
			auto error_string = error.str();
			FullLinePosition::SanitizeError(error_string);

			current_errors.ModifyErrorMessageOfLastError(error_string);
		}
	}
	cur_col_id++;
	chunk_col_id++;
}